

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arc.c
# Opt level: O2

error parse_simple(char *start,char *end,atom *result)

{
  char *end_00;
  long lVar1;
  double dVar2;
  int iVar3;
  error eVar4;
  void *__ptr;
  char cVar5;
  anon_union_8_9_1d3277aa_for_value aVar6;
  size_t sVar7;
  ulong uVar8;
  char *pcVar9;
  long lVar10;
  atom aVar11;
  atom aVar12;
  atom car_val;
  atom car_val_00;
  atom car_val_01;
  atom car_val_02;
  atom car_val_03;
  atom car_val_04;
  atom cdr_val;
  atom cdr_val_00;
  atom cdr_val_01;
  double dStack_70;
  atom a2;
  atom a1;
  atom a1_1;
  char *p;
  
  dVar2 = strtod(start,&p);
  if (p == end) {
    result->type = T_NUM;
    (result->value).number = dVar2;
  }
  else {
    if (*start == '#') {
      sVar7 = (long)end - (long)start;
      pcVar9 = (char *)malloc(sVar7 + 1);
      memcpy(pcVar9,start,sVar7);
      pcVar9[sVar7] = '\0';
      if ((sVar7 != 3) || (pcVar9[1] != '\\')) {
        iVar3 = strcmp(pcVar9,"#\\nul");
        if (iVar3 == 0) {
          dStack_70 = 0.0;
        }
        else {
          iVar3 = strcmp(pcVar9,"#\\return");
          if (iVar3 == 0) {
            dStack_70 = 6.42285339593621e-323;
          }
          else {
            iVar3 = strcmp(pcVar9,"#\\newline");
            if (iVar3 == 0) {
              dStack_70 = 4.94065645841247e-323;
            }
            else {
              iVar3 = strcmp(pcVar9,"#\\tab");
              if (iVar3 == 0) {
                dStack_70 = 4.44659081257122e-323;
              }
              else {
                iVar3 = strcmp(pcVar9,"#\\space");
                if (iVar3 != 0) {
LAB_001047f3:
                  free(pcVar9);
                  return ERROR_SYNTAX;
                }
                dStack_70 = 1.58101006669199e-322;
              }
            }
          }
        }
        free(pcVar9);
        result->type = T_CHAR;
        (result->value).number = dStack_70;
        return ERROR_OK;
      }
      aVar6._1_7_ = 0;
      aVar6.ch = pcVar9[2];
      result->type = T_CHAR;
      result->value = aVar6;
    }
    else {
      if (*start == '\"') {
        result->type = T_STRING;
        __ptr = malloc((size_t)(end + ~(ulong)start));
        sVar7 = 1;
        while (pcVar9 = start + 1, pcVar9 < end + -1) {
          cVar5 = *pcVar9;
          if (cVar5 == '\\') {
            cVar5 = start[2];
            pcVar9 = start + 2;
            if (cVar5 == 't') {
              cVar5 = '\t';
            }
            else if (cVar5 == 'r') {
              cVar5 = '\r';
            }
            else if (cVar5 == 'n') {
              cVar5 = '\n';
            }
          }
          *(char *)((long)__ptr + (sVar7 - 1)) = cVar5;
          sVar7 = sVar7 + 1;
          start = pcVar9;
        }
        *(undefined1 *)((long)__ptr + (sVar7 - 1)) = 0;
        pcVar9 = (char *)realloc(__ptr,sVar7);
        aVar11 = make_string(pcVar9);
        result->type = T_STRING;
        result->value = aVar11.value;
        return ERROR_OK;
      }
      sVar7 = (long)end - (long)start;
      pcVar9 = (char *)malloc(sVar7 + 1);
      memcpy(pcVar9,start,sVar7);
      pcVar9[sVar7] = '\0';
      iVar3 = strcmp(pcVar9,"nil");
      if (iVar3 == 0) {
        *(undefined8 *)result = 0;
        (result->value).number = 0.0;
      }
      else {
        if ((*pcVar9 != '.') || (pcVar9[1] != '\0')) {
          end_00 = pcVar9 + sVar7;
          for (lVar10 = 0; lVar1 = sVar7 + lVar10, -1 < lVar1 + -1; lVar10 = lVar10 + -1) {
            cVar5 = end_00[lVar10 + -1];
            if (cVar5 == '!') {
              if ((lVar10 == 0 || lVar1 == 1) ||
                 (eVar4 = parse_simple(pcVar9,pcVar9 + lVar1 + -1,&a1), eVar4 != ERROR_OK))
              goto LAB_001047f3;
              eVar4 = parse_simple(pcVar9 + sVar7 + lVar10,end_00,&a2);
              free(pcVar9);
              if (eVar4 != ERROR_OK) {
                return ERROR_SYNTAX;
              }
              aVar11._4_4_ = 0;
              aVar11.type = a2.type;
              aVar11.value.number = a2.value.number;
              aVar11 = cons(aVar11,(atom)ZEXT816(0));
              aVar12._4_4_ = 0;
              aVar12.type = sym_quote.type;
              aVar12.value.number = sym_quote.value.number;
              cdr_val.value.number = aVar11.value.number;
              cdr_val._0_8_ = 1;
              aVar11 = cons(aVar12,cdr_val);
              car_val_00.value.number = aVar11.value.number;
              car_val_00._0_8_ = 1;
              aVar11 = cons(car_val_00,(atom)ZEXT816(0));
              aVar6 = aVar11.value;
              uVar8 = (ulong)a1.type;
              goto LAB_00104889;
            }
            if (cVar5 == ':') {
              if ((lVar10 == 0 || lVar1 == 1) ||
                 (eVar4 = parse_simple(pcVar9,pcVar9 + lVar1 + -1,&a1), eVar4 != ERROR_OK))
              goto LAB_001047f3;
              eVar4 = parse_simple(pcVar9 + sVar7 + lVar10,end_00,&a2);
              free(pcVar9);
              if (eVar4 != ERROR_OK) {
                return ERROR_SYNTAX;
              }
              aVar11 = make_sym("compose");
              car_val_02._4_4_ = 0;
              car_val_02.type = a2.type;
              car_val_02.value.number = a2.value.number;
              aVar12 = cons(car_val_02,(atom)ZEXT816(0));
              car_val_03._4_4_ = 0;
              car_val_03.type = a1.type;
              car_val_03.value.number = a1.value.number;
              cdr_val_00.value.number = aVar12.value.number;
              cdr_val_00._0_8_ = 1;
              aVar12 = cons(car_val_03,cdr_val_00);
              aVar6 = aVar12.value;
              uVar8 = 2;
              a1.value = aVar11.value;
              goto LAB_00104889;
            }
            if (cVar5 == '.') {
              if ((lVar10 == 0 || lVar1 == 1) ||
                 (eVar4 = parse_simple(pcVar9,pcVar9 + lVar1 + -1,&a1), eVar4 != ERROR_OK))
              goto LAB_001047f3;
              eVar4 = parse_simple(pcVar9 + sVar7 + lVar10,end_00,&a2);
              free(pcVar9);
              if (eVar4 != ERROR_OK) {
                return ERROR_SYNTAX;
              }
              car_val_01._4_4_ = 0;
              car_val_01.type = a2.type;
              car_val_01.value.number = a2.value.number;
              aVar11 = cons(car_val_01,(atom)ZEXT816(0));
              aVar6 = aVar11.value;
              uVar8 = (ulong)a1.type;
              goto LAB_00104889;
            }
          }
          if (*pcVar9 == '~' && 1 < (long)sVar7) {
            eVar4 = parse_simple(pcVar9 + 1,end_00,&a1_1);
            free(pcVar9);
            if (eVar4 != ERROR_OK) {
              return ERROR_SYNTAX;
            }
            aVar11 = make_sym("complement");
            car_val._4_4_ = 0;
            car_val.type = a1_1.type;
            car_val.value.number = a1_1.value.number;
            aVar12 = cons(car_val,(atom)ZEXT816(0));
            aVar6 = aVar12.value;
            uVar8 = 2;
            a1.value = aVar11.value;
LAB_00104889:
            car_val_04.value.number = a1.value.number;
            car_val_04._0_8_ = uVar8;
            cdr_val_01.value.number = aVar6.number;
            cdr_val_01._0_8_ = 1;
            aVar11 = cons(car_val_04,cdr_val_01);
            result->type = T_CONS;
            result->value = aVar11.value;
            return ERROR_OK;
          }
        }
        aVar11 = make_sym(pcVar9);
        result->type = T_SYM;
        result->value = aVar11.value;
      }
    }
    free(pcVar9);
  }
  return ERROR_OK;
}

Assistant:

error parse_simple(const char *start, const char *end, atom *result)
{
	char *p;

	/* Is it a number? */
	double val = strtod(start, &p);
	if (p == end) {
		result->type = T_NUM;
		result->value.number = val;
		return ERROR_OK;
	}
	else if (start[0] == '"') { /* "string" */
		result->type = T_STRING;
		size_t length = end - start - 2;
		char *buf = (char*)malloc(length + 1);
		const char *ps = start + 1;
		char *pt = buf;
		while (ps < end - 1) {
			if (*ps == '\\') {
				char c_next = *(ps + 1);
				switch (c_next) {
				case 'r':
					*pt = '\r';
					break;
				case 'n':
					*pt = '\n';
					break;
				case 't':
					*pt = '\t';
					break;
				default:
					*pt = c_next;
				}
				ps++;
			}
			else {
				*pt = *ps;
			}
			ps++;
			pt++;
		}
		*pt = 0;
		buf = realloc(buf, pt - buf + 1);
		*result = make_string(buf);
		return ERROR_OK;
	}
	else if (start[0] == '#') { /* #\char */
		char *buf = malloc(end - start + 1);
		memcpy(buf, start, end - start);
		buf[end - start] = 0;
		size_t length = end - start;
		if (length == 3 && buf[1] == '\\') { /* plain character e.g. #\a */
			*result = make_char(buf[2]);
			free(buf);
			return ERROR_OK;
		}
		else {
			char c;
			if (strcmp(buf, "#\\nul") == 0)
				c = '\0';
			else if (strcmp(buf, "#\\return") == 0)
				c = '\r';
			else if (strcmp(buf, "#\\newline") == 0)
				c = '\n';
			else if (strcmp(buf, "#\\tab") == 0)
				c = '\t';
			else if (strcmp(buf, "#\\space") == 0)
				c = ' ';
			else {
				free(buf);
				return ERROR_SYNTAX;
			}
			free(buf);
			*result = make_char(c);
			return ERROR_OK;
		}
	}

	/* NIL or symbol */
	char *buf = malloc(end - start + 1);
	memcpy(buf, start, end - start);
	buf[end - start] = 0;

	if (strcmp(buf, "nil") == 0)
		*result = nil;
	else if (strcmp(buf, ".") == 0)
		*result = make_sym(buf);
	else {
		atom a1, a2;
		long length = end - start, i;
		for (i = length - 1; i >= 0; i--) { /* left-associative */
			if (buf[i] == '.') { /* a.b => (a b) */
				if (i == 0 || i == length - 1) {
					free(buf);
					return ERROR_SYNTAX;
				}
				error err;
				err = parse_simple(buf, buf + i, &a1);
				if (err) {
					free(buf);
					return ERROR_SYNTAX;
				}
				err = parse_simple(buf + i + 1, buf + length, &a2);
				if (err) {
					free(buf);
					return ERROR_SYNTAX;
				}
				free(buf);
				*result = cons(a1, cons(a2, nil));
				return ERROR_OK;
			}
			else if (buf[i] == '!') { /* a!b => (a 'b) */
				if (i == 0 || i == length - 1) {
					free(buf);
					return ERROR_SYNTAX;
				}
				error err;
				err = parse_simple(buf, buf + i, &a1);
				if (err) {
					free(buf);
					return ERROR_SYNTAX;
				}
				err = parse_simple(buf + i + 1, buf + length, &a2);
				if (err) {
					free(buf);
					return ERROR_SYNTAX;
				}
				free(buf);
				*result = cons(a1, cons(cons(sym_quote, cons(a2, nil)), nil));
				return ERROR_OK;
			}
			else if (buf[i] == ':') { /* a:b => (compose a b) */
				if (i == 0 || i == length - 1) {
					free(buf);
					return ERROR_SYNTAX;
				}
				error err;
				err = parse_simple(buf, buf + i, &a1);
				if (err) {
					free(buf);
					return ERROR_SYNTAX;
				}
				err = parse_simple(buf + i + 1, buf + length, &a2);
				if (err) {
					free(buf);
					return ERROR_SYNTAX;
				}
				free(buf);
				*result = cons(make_sym("compose"), cons(a1, cons(a2, nil)));
				return ERROR_OK;
			}
		}
		if (length >= 2 && buf[0] == '~') { /* ~a => (complement a) */
			atom a1;
			error err = parse_simple(buf + 1, buf + length, &a1);
			free(buf);
			if (err) {
				return ERROR_SYNTAX;
			}
			*result = cons(make_sym("complement"), cons(a1, nil));
			return ERROR_OK;
		}
		*result = make_sym(buf);
	}

	free(buf);
	return ERROR_OK;
}